

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_occlusion_query(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_occlusion_query != 0) {
    glad_glGenOcclusionQueriesNV =
         (PFNGLGENOCCLUSIONQUERIESNVPROC)(*load)("glGenOcclusionQueriesNV");
    glad_glDeleteOcclusionQueriesNV =
         (PFNGLDELETEOCCLUSIONQUERIESNVPROC)(*load)("glDeleteOcclusionQueriesNV");
    glad_glIsOcclusionQueryNV = (PFNGLISOCCLUSIONQUERYNVPROC)(*load)("glIsOcclusionQueryNV");
    glad_glBeginOcclusionQueryNV =
         (PFNGLBEGINOCCLUSIONQUERYNVPROC)(*load)("glBeginOcclusionQueryNV");
    glad_glEndOcclusionQueryNV = (PFNGLENDOCCLUSIONQUERYNVPROC)(*load)("glEndOcclusionQueryNV");
    glad_glGetOcclusionQueryivNV =
         (PFNGLGETOCCLUSIONQUERYIVNVPROC)(*load)("glGetOcclusionQueryivNV");
    glad_glGetOcclusionQueryuivNV =
         (PFNGLGETOCCLUSIONQUERYUIVNVPROC)(*load)("glGetOcclusionQueryuivNV");
  }
  return;
}

Assistant:

static void load_GL_NV_occlusion_query(GLADloadproc load) {
	if(!GLAD_GL_NV_occlusion_query) return;
	glad_glGenOcclusionQueriesNV = (PFNGLGENOCCLUSIONQUERIESNVPROC)load("glGenOcclusionQueriesNV");
	glad_glDeleteOcclusionQueriesNV = (PFNGLDELETEOCCLUSIONQUERIESNVPROC)load("glDeleteOcclusionQueriesNV");
	glad_glIsOcclusionQueryNV = (PFNGLISOCCLUSIONQUERYNVPROC)load("glIsOcclusionQueryNV");
	glad_glBeginOcclusionQueryNV = (PFNGLBEGINOCCLUSIONQUERYNVPROC)load("glBeginOcclusionQueryNV");
	glad_glEndOcclusionQueryNV = (PFNGLENDOCCLUSIONQUERYNVPROC)load("glEndOcclusionQueryNV");
	glad_glGetOcclusionQueryivNV = (PFNGLGETOCCLUSIONQUERYIVNVPROC)load("glGetOcclusionQueryivNV");
	glad_glGetOcclusionQueryuivNV = (PFNGLGETOCCLUSIONQUERYUIVNVPROC)load("glGetOcclusionQueryuivNV");
}